

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals __thiscall Omega_h::resize_symms_tmpl<2,3>(Omega_h *this,Reals *old_symms)

{
  Alloc *pAVar1;
  int n;
  void *extraout_RDX;
  size_t sVar2;
  Reals RVar3;
  allocator local_59;
  type f;
  Write<double> new_symms;
  Write<signed_char> local_28;
  
  pAVar1 = (old_symms->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  n = divide_no_remainder<int>((int)(sVar2 >> 3),3);
  std::__cxx11::string::string((string *)&f,"",&local_59);
  Write<double>::Write(&new_symms,n * 6,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<double>::Write((Write<double> *)&f,&old_symms->write_);
  Write<double>::Write(&f.new_symms,&new_symms);
  parallel_for<Omega_h::resize_symms_tmpl<2,3>(Omega_h::Read<double>)::_lambda(int)_1_>
            (n,&f,"resize_symms");
  Write<double>::Write(&local_28,(Write<signed_char> *)&new_symms);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_28);
  Write<double>::~Write((Write<double> *)&local_28);
  resize_symms_tmpl<2,3>(Omega_h::Read<double>)::{lambda(int)#1}::~Read((_lambda_int__1_ *)&f);
  Write<double>::~Write(&new_symms);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals resize_symms_tmpl(Reals old_symms) {
  auto n = divide_no_remainder(old_symms.size(), symm_ncomps(old_dim));
  Write<Real> new_symms(n * symm_ncomps(new_dim));
  constexpr auto min_dim = min2(old_dim, new_dim);
  auto f = OMEGA_H_LAMBDA(Int i) {
    auto a = get_symm<old_dim>(old_symms, i);
    auto b = zero_matrix<new_dim, new_dim>();
    for (Int j = 0; j < min_dim; ++j) {
      for (Int k = 0; k < min_dim; ++k) {
        b[j][k] = a[j][k];
      }
    }
    set_symm(new_symms, i, b);
  };
  parallel_for(n, f, "resize_symms");
  return new_symms;
}